

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processingNumber(CScanner *this,char c)

{
  bool bVar1;
  TDigitIndex TVar2;
  TDigit local_98;
  byte local_92;
  allocator local_71;
  string local_70 [55];
  undefined1 local_39;
  undefined1 local_38 [7];
  bool isNumber;
  CArbitraryInteger number;
  char c_local;
  CScanner *this_local;
  
  number._31_1_ = c;
  bVar1 = IsDigit(c);
  if (bVar1) {
    std::__cxx11::string::operator+=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,number._31_1_);
  }
  else if (number._31_1_ == '/') {
    CArbitraryInteger::CArbitraryInteger((CArbitraryInteger *)local_38);
    local_39 = CArbitraryInteger::SetValueByText
                         ((CArbitraryInteger *)local_38,
                          &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                           super_CQualifierParser.token.word);
    if (!(bool)local_39) {
      __assert_fail("isNumber",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0x270,"void Refal2::CScanner::processingNumber(char)");
    }
    bVar1 = CArbitraryInteger::IsZero((CArbitraryInteger *)local_38);
    local_92 = 1;
    if (!bVar1) {
      bVar1 = CArbitraryInteger::IsNegative((CArbitraryInteger *)local_38);
      local_92 = bVar1 ^ 0xff;
    }
    if ((local_92 & 1) == 0) {
      __assert_fail("number.IsZero() || !number.IsNegative()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0x271,"void Refal2::CScanner::processingNumber(char)");
    }
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_Number;
    bVar1 = CArbitraryInteger::IsZero((CArbitraryInteger *)local_38);
    if (bVar1) {
      local_98 = 0;
    }
    else {
      local_98 = CArbitraryInteger::GetDigit((CArbitraryInteger *)local_38,0);
    }
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.
    number = local_98;
    TVar2 = CArbitraryInteger::GetSize((CArbitraryInteger *)local_38);
    if (1 < TVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"a constant value is too large for the number (max 2^24 - 1)",&local_71);
      CErrorsHelper::RaiseError
                ((CErrorsHelper *)this,ES_Error,(string *)local_70,
                 &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                  super_CQualifierParser.token);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    addToken(this,TT_Number);
    this->state = S_Initial;
    CArbitraryInteger::~CArbitraryInteger((CArbitraryInteger *)local_38);
  }
  else {
    error(this,E_UnclosedNumber,number._31_1_);
    this->state = S_Initial;
    processing(this,number._31_1_);
  }
  return;
}

Assistant:

void CScanner::processingNumber( char c )
{
	if( IsDigit( c ) ) {
		token.word += c;
	} else if( c == LimiterOfSymbol ) {
		CArbitraryInteger number;
		const bool isNumber = number.SetValueByText( token.word );
		assert( isNumber );
		assert( number.IsZero() || !number.IsNegative() );
		token.type = TT_Number;
		token.number = number.IsZero() ? 0 : number.GetDigit( 0 );
		if( number.GetSize() > 1 ) {
			CErrorsHelper::RaiseError( ES_Error,
				"a constant value is too large for the number (max 2^24 - 1)",
				token );
		}
		addToken( TT_Number );
		state = S_Initial;
	} else {
		error( E_UnclosedNumber, c );
		state = S_Initial;
		processing( c );
	}
}